

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrans_avx2.c
# Opt level: O3

void itrans_dct2_h8_w4_avx2(s16 *src,s16 *dst,int bit_depth)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  int iVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  s16 tmp [32];
  undefined1 local_80 [16];
  undefined1 local_70 [16];
  undefined1 local_60 [16];
  undefined1 local_50 [16];
  
  dct2_butterfly_h8_sse(src,4,(s16 *)local_80,4,5,0xf);
  uVar5 = 0x14 - bit_depth;
  iVar6 = 1 << (0x13 - (byte)bit_depth & 0x1f);
  auVar7._4_4_ = iVar6;
  auVar7._0_4_ = iVar6;
  auVar7._8_4_ = iVar6;
  auVar7._12_4_ = iVar6;
  auVar7._16_4_ = iVar6;
  auVar7._20_4_ = iVar6;
  auVar7._24_4_ = iVar6;
  auVar7._28_4_ = iVar6;
  auVar3 = vpunpcklwd_avx(local_80,local_60);
  auVar1 = vpunpckhwd_avx(local_80,local_60);
  auVar4 = vpunpcklwd_avx(local_70,local_50);
  auVar2 = vpunpckhwd_avx(local_70,local_50);
  auVar8._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar3;
  auVar8._16_16_ = ZEXT116(1) * auVar1;
  auVar13._8_2_ = 0x20;
  auVar13._0_8_ = 0x20002000200020;
  auVar13._10_2_ = 0x20;
  auVar13._12_2_ = 0x20;
  auVar13._14_2_ = 0x20;
  auVar13._16_2_ = 0x20;
  auVar13._18_2_ = 0x20;
  auVar13._20_2_ = 0x20;
  auVar13._22_2_ = 0x20;
  auVar13._24_2_ = 0x20;
  auVar13._26_2_ = 0x20;
  auVar13._28_2_ = 0x20;
  auVar13._30_2_ = 0x20;
  auVar10 = vpmaddwd_avx2(auVar8,_DAT_00184c00);
  auVar8 = vpmaddwd_avx2(auVar8,auVar13);
  auVar9._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar4;
  auVar9._16_16_ = ZEXT116(1) * auVar2;
  auVar13 = vpmaddwd_avx2(auVar9,_DAT_00184bc0);
  auVar12 = vpmaddwd_avx2(auVar9,_DAT_00184be0);
  auVar8 = vpaddd_avx2(auVar8,auVar7);
  auVar9 = vpaddd_avx2(auVar8,auVar13);
  auVar10 = vpaddd_avx2(auVar10,auVar7);
  auVar7 = vpaddd_avx2(auVar10,auVar12);
  auVar12 = vpsubd_avx2(auVar10,auVar12);
  auVar9 = vpsrad_avx2(auVar9,ZEXT416(uVar5));
  auVar10 = vpsrad_avx2(auVar7,ZEXT416(uVar5));
  auVar7 = vpsubd_avx2(auVar8,auVar13);
  auVar8 = vpsrad_avx2(auVar12,ZEXT416(uVar5));
  auVar8 = vpackssdw_avx2(auVar9,auVar8);
  auVar9 = vpsrad_avx2(auVar7,ZEXT416(uVar5));
  auVar9 = vpackssdw_avx2(auVar10,auVar9);
  auVar10 = vpunpcklwd_avx2(auVar8,auVar9);
  auVar9 = vpunpckhwd_avx2(auVar8,auVar9);
  auVar8 = vpunpckldq_avx2(auVar10,auVar9);
  auVar9 = vpunpckhdq_avx2(auVar10,auVar9);
  if (bit_depth != 0xf) {
    iVar6 = 1 << ((byte)bit_depth & 0x1f);
    auVar10._0_2_ = (undefined2)-iVar6;
    auVar10._2_2_ = auVar10._0_2_;
    auVar10._4_2_ = auVar10._0_2_;
    auVar10._6_2_ = auVar10._0_2_;
    auVar10._8_2_ = auVar10._0_2_;
    auVar10._10_2_ = auVar10._0_2_;
    auVar10._12_2_ = auVar10._0_2_;
    auVar10._14_2_ = auVar10._0_2_;
    auVar10._16_2_ = auVar10._0_2_;
    auVar10._18_2_ = auVar10._0_2_;
    auVar10._20_2_ = auVar10._0_2_;
    auVar10._22_2_ = auVar10._0_2_;
    auVar10._24_2_ = auVar10._0_2_;
    auVar10._26_2_ = auVar10._0_2_;
    auVar10._28_2_ = auVar10._0_2_;
    auVar10._30_2_ = auVar10._0_2_;
    auVar12._0_2_ = (undefined2)(iVar6 + -1);
    auVar12._2_2_ = auVar12._0_2_;
    auVar12._4_2_ = auVar12._0_2_;
    auVar12._6_2_ = auVar12._0_2_;
    auVar12._8_2_ = auVar12._0_2_;
    auVar12._10_2_ = auVar12._0_2_;
    auVar12._12_2_ = auVar12._0_2_;
    auVar12._14_2_ = auVar12._0_2_;
    auVar12._16_2_ = auVar12._0_2_;
    auVar12._18_2_ = auVar12._0_2_;
    auVar12._20_2_ = auVar12._0_2_;
    auVar12._22_2_ = auVar12._0_2_;
    auVar12._24_2_ = auVar12._0_2_;
    auVar12._26_2_ = auVar12._0_2_;
    auVar12._28_2_ = auVar12._0_2_;
    auVar12._30_2_ = auVar12._0_2_;
    auVar8 = vpminsw_avx2(auVar8,auVar12);
    auVar9 = vpminsw_avx2(auVar9,auVar12);
    auVar8 = vpmaxsw_avx2(auVar8,auVar10);
    auVar9 = vpmaxsw_avx2(auVar9,auVar10);
  }
  auVar11._0_16_ = ZEXT116(0) * auVar9._0_16_ + ZEXT116(1) * auVar8._0_16_;
  auVar11._16_16_ = ZEXT116(0) * auVar8._16_16_ + ZEXT116(1) * auVar9._0_16_;
  *(undefined1 (*) [32])dst = auVar11;
  auVar8 = vperm2i128_avx2(auVar8,auVar9,0x31);
  *(undefined1 (*) [32])(dst + 0x10) = auVar8;
  return;
}

Assistant:

void itrans_dct2_h8_w4_avx2(s16 *src, s16 *dst, int bit_depth)
{
    ALIGNED_32(s16 tmp[8 * 4]);
    dct2_butterfly_h8_sse(src, 4, tmp, 4, 5, MAX_TX_DYNAMIC_RANGE);
    dct2_butterfly_h4_avx2(tmp, dst, 8, 20 - bit_depth, bit_depth);
}